

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

TEXTURE_FORMAT __thiscall
Diligent::TexFormatToViewFormatConverter::GetViewFormat
          (TexFormatToViewFormatConverter *this,TEXTURE_FORMAT Format,TEXTURE_VIEW_TYPE ViewType,
          Uint32 BindFlags)

{
  uint uVar1;
  Char *pCVar2;
  reference this_00;
  reference pvVar3;
  undefined1 local_90 [8];
  string msg_2;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  Uint32 BindFlags_local;
  TEXTURE_VIEW_TYPE ViewType_local;
  TEXTURE_FORMAT Format_local;
  TexFormatToViewFormatConverter *this_local;
  
  msg.field_2._8_4_ = BindFlags;
  msg.field_2._M_local_buf[0xd] = ViewType;
  msg.field_2._14_2_ = Format;
  if ((ViewType == TEXTURE_VIEW_UNDEFINED) || (TEXTURE_VIEW_SHADING_RATE < ViewType)) {
    FormatString<char[29]>((string *)local_40,(char (*) [29])"Unexpected texture view type");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"GetViewFormat",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xee);
    std::__cxx11::string::~string((string *)local_40);
  }
  if (0x69 < (ushort)msg.field_2._14_2_) {
    FormatString<char[23]>
              ((string *)((long)&msg_2.field_2 + 8),(char (*) [23])"Unknown texture format");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"GetViewFormat",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xef);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if ((msg.field_2._14_2_ != 0x35) || ((msg.field_2._8_4_ & 0x40) == 0)) {
    this_00 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                        (&this->m_ViewFormats,(ulong)(ushort)msg.field_2._14_2_);
    pvVar3 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[]
                       (this_00,(long)(int)((byte)msg.field_2._M_local_buf[0xd] - 1));
    return *pvVar3;
  }
  uVar1 = (uint)(byte)msg.field_2._M_local_buf[0xd];
  if (1 < uVar1 - 1) {
    if (uVar1 - 3 < 2) {
      return TEX_FORMAT_D16_UNORM;
    }
    if (uVar1 != 5) {
      if (uVar1 != 6) {
        FormatString<char[29]>((string *)local_90,(char (*) [29])"Unexpected texture view type");
        pCVar2 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar2,"GetViewFormat",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                   ,0x105);
        std::__cxx11::string::~string((string *)local_90);
        return TEX_FORMAT_UNKNOWN;
      }
      return TEX_FORMAT_UNKNOWN;
    }
  }
  return TEX_FORMAT_R16_UNORM;
}

Assistant:

TEXTURE_FORMAT GetViewFormat(TEXTURE_FORMAT Format, TEXTURE_VIEW_TYPE ViewType, Uint32 BindFlags)
    {
        VERIFY(ViewType > TEXTURE_VIEW_UNDEFINED && ViewType < TEXTURE_VIEW_NUM_VIEWS, "Unexpected texture view type");
        VERIFY(Format >= TEX_FORMAT_UNKNOWN && Format < TEX_FORMAT_NUM_FORMATS, "Unknown texture format");
        switch (Format)
        {
            case TEX_FORMAT_R16_TYPELESS:
            {
                if (BindFlags & BIND_DEPTH_STENCIL)
                {
                    switch (ViewType)
                    {
                        case TEXTURE_VIEW_SHADER_RESOURCE:
                        case TEXTURE_VIEW_RENDER_TARGET:
                        case TEXTURE_VIEW_UNORDERED_ACCESS:
                            return TEX_FORMAT_R16_UNORM;

                        case TEXTURE_VIEW_DEPTH_STENCIL:
                        case TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL:
                            return TEX_FORMAT_D16_UNORM;

                        case TEXTURE_VIEW_SHADING_RATE:
                            return TEX_FORMAT_UNKNOWN;

                        default:
                            UNEXPECTED("Unexpected texture view type");
                            return TEX_FORMAT_UNKNOWN;
                    }
                    static_assert(TEXTURE_VIEW_NUM_VIEWS == 7, "Please handle the new view type in the switch above, if necessary");
                }
            }

            default: /*do nothing*/ break;
        }

        return m_ViewFormats[Format][ViewType - 1];
    }